

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

void __thiscall capnp::MembraneHook::removeFromMap(MembraneHook *this)

{
  long lVar1;
  DebugExpression<bool> _kjCondition;
  Fault f;
  DebugExpression<bool> local_9;
  Fault local_8;
  
  lVar1 = 8;
  if (this->reverse != false) {
    lVar1 = 0x50;
  }
  local_8.exception = (Exception *)(this->inner).ptr;
  local_9.value =
       kj::
       Table<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>>
       ::eraseMatch<0ul,capnp::ClientHook*&>
                 ((Table<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>>
                   *)((long)&((this->policy).ptr)->_vptr_MembranePolicy + lVar1),
                  (ClientHook **)&local_8);
  if (local_9.value) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&local_8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
             ,0x229,FAILED,"map.erase(inner.get())","_kjCondition,",&local_9);
  kj::_::Debug::Fault::fatal(&local_8);
}

Assistant:

void removeFromMap() noexcept {
    // Remove this object from the policy's wrapper map.

    auto& map = reverse ? policy->reverseWrappers : policy->wrappers;

    // If this map.erase() fails, there's a good chance we have left a dangling pointer somewhere,
    // hence this method is declared `noexcept` so that we end up crashing promptly.
    KJ_ASSERT(map.erase(inner.get()));
  }